

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vehicle.cpp
# Opt level: O3

bool __thiscall Vehicle::is_point_on_vehicle(Vehicle *this,Point *p)

{
  int iVar1;
  int iVar2;
  _List_node_base *p_Var3;
  _List_node_base *p_Var4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  
  p_Var3 = (this->nodes).
           super__List_base<std::shared_ptr<VehicleState>,_std::allocator<std::shared_ptr<VehicleState>_>_>
           ._M_impl._M_node.super__List_node_base._M_next;
  do {
    if (p_Var3 == (_List_node_base *)&this->nodes) {
      return false;
    }
    p_Var4 = p_Var3[1]._M_next;
    this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var3[1]._M_prev;
    if (this_00 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (*(int *)p_Var4->_M_next == p->id) {
        return true;
      }
    }
    else {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_00->_M_use_count = this_00->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_00->_M_use_count = this_00->_M_use_count + 1;
      }
      iVar1 = *(int *)p_Var4->_M_next;
      iVar2 = p->id;
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      if (iVar1 == iVar2) {
        return true;
      }
    }
    p_Var3 = p_Var3->_M_next;
  } while( true );
}

Assistant:

bool Vehicle::is_point_on_vehicle(Point *p) {
    for (auto value_: nodes) {
        if (value_->p->id == p->id) {
            return true;
        }
    }
    return false;
}